

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O1

void __thiscall wabt::OpcodeInfo::Write(OpcodeInfo *this,Stream *stream)

{
  uint uVar1;
  Enum EVar2;
  double *pdVar3;
  unsigned_long *puVar4;
  Enum *pEVar5;
  float *pfVar6;
  uint *puVar7;
  Type *pTVar8;
  Info *pIVar9;
  char *pcVar10;
  unsigned_long uVar11;
  pair<const_unsigned_int_*,_unsigned_long> pVar12;
  char buffer [41];
  Info local_68;
  
  pIVar9 = &local_68;
  Opcode::GetInfo(&local_68,&this->opcode_);
  Stream::Writef(stream,"%s",CONCAT44(local_68.name._4_4_,(Enum)local_68.name));
  switch(this->kind_) {
  case Uint32:
    puVar7 = GetData<unsigned_int>(this,1);
    uVar1 = *puVar7;
    puVar7 = GetData<unsigned_int>(this,1);
    Stream::Writef(stream," %u (0x%x)",(ulong)uVar1,(ulong)*puVar7);
    break;
  case Uint64:
    puVar4 = GetData<unsigned_long>(this,1);
    uVar11 = *puVar4;
    puVar4 = GetData<unsigned_long>(this,1);
    Stream::Writef(stream," %lu (0x%lx)",uVar11,*puVar4);
    break;
  case Index:
    pEVar5 = (Enum *)GetData<unsigned_int>(this,1);
    EVar2 = *pEVar5;
    pcVar10 = " %u";
LAB_00128adf:
    Stream::Writef(stream,pcVar10,(ulong)(uint)EVar2);
    break;
  case Float32:
    pfVar6 = GetData<float>(this,1);
    Stream::Writef(stream," %g",(double)*pfVar6);
    puVar7 = GetData<unsigned_int>(this,1);
    WriteFloatHex((char *)&local_68,0x15,*puVar7);
    goto LAB_001289a9;
  case Float64:
    pdVar3 = GetData<double>(this,1);
    Stream::Writef(stream," %g",*pdVar3);
    puVar4 = GetData<unsigned_long>(this,1);
    WriteDoubleHex((char *)&local_68,0x29,*puVar4);
LAB_001289a9:
    pcVar10 = " (%s)";
LAB_001289b6:
    Stream::Writef(stream,pcVar10,pIVar9);
    break;
  case Uint32Uint32:
    pVar12 = GetDataArray<unsigned_int>(this);
    if (pVar12.second != 0) {
      uVar11 = 0;
      do {
        pcVar10 = ", ";
        if (uVar11 == 0) {
          pcVar10 = " ";
        }
        Stream::Writef(stream,"%s",pcVar10);
        Stream::Writef(stream,"%u",(ulong)pVar12.first[uVar11]);
        uVar11 = uVar11 + 1;
      } while (pVar12.second != uVar11);
    }
    break;
  case BlockSig:
    pTVar8 = GetData<wabt::Type>(this,1);
    EVar2 = pTVar8->enum_;
    local_68.name._0_4_ = EVar2;
    if (I32 < EVar2) {
      pcVar10 = " type:%d";
      goto LAB_00128adf;
    }
    if (EVar2 == Void) {
      return;
    }
    pIVar9 = (Info *)Type::GetName((Type *)&local_68);
    pcVar10 = " %s";
    goto LAB_001289b6;
  case BrTable:
    pVar12 = GetDataArray<unsigned_int>(this);
    if (pVar12.second != 0) {
      uVar11 = 0;
      do {
        pcVar10 = ", ";
        if (uVar11 == 0) {
          pcVar10 = " ";
        }
        Stream::Writef(stream,"%s",pcVar10);
        Stream::Writef(stream,"%u",(ulong)pVar12.first[uVar11]);
        uVar11 = uVar11 + 1;
      } while (pVar12.second != uVar11);
    }
  }
  return;
}

Assistant:

void OpcodeInfo::Write(Stream& stream) {
  stream.Writef("%s", opcode_.GetName());

  switch (kind_) {
    case Kind::Bare:
      break;

    case Kind::Uint32:
      stream.Writef(" %u (0x%x)", *GetData<uint32_t>(), *GetData<uint32_t>());
      break;

    case Kind::Uint64:
      stream.Writef(" %" PRIu64 " (0x%" PRIx64 ")", *GetData<uint64_t>(),
                    *GetData<uint64_t>());
      break;

    case Kind::Index:
      stream.Writef(" %" PRIindex, *GetData<Index>());
      break;

    case Kind::Float32: {
      stream.Writef(" %g", *GetData<float>());
      char buffer[WABT_MAX_FLOAT_HEX + 1];
      WriteFloatHex(buffer, sizeof(buffer), *GetData<uint32_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Float64: {
      stream.Writef(" %g", *GetData<double>());
      char buffer[WABT_MAX_DOUBLE_HEX + 1];
      WriteDoubleHex(buffer, sizeof(buffer), *GetData<uint64_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Uint32Uint32:
      WriteArray<uint32_t>(
          stream, [&stream](uint32_t value) { stream.Writef("%u", value); });
      break;

    case Kind::BlockSig: {
      auto type = *GetData<Type>();
      if (type.IsIndex()) {
        stream.Writef(" type:%d", type.GetIndex());
      } else if (type != Type::Void) {
        stream.Writef(" %s", type.GetName());
      }
      break;
    }

    case Kind::BrTable: {
      WriteArray<Index>(stream, [&stream](Index index) {
        stream.Writef("%" PRIindex, index);
      });
      break;
    }
  }
}